

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

SharedPtr __thiscall
deqp::gles31::Functional::anon_unknown_0::generateRandomShaderSet
          (anon_unknown_0 *this,Random *rnd,GLSLVersion glslVersion,bool onlyExtensionStages)

{
  SharedPtr SVar2;
  bool onlyExtensionStages_local;
  GLSLVersion glslVersion_local;
  Random *rnd_local;
  SharedPtrStateBase *pSVar1;
  
  if (onlyExtensionStages) {
    SVar2 = generateRandomExtShaderSet(this,rnd,glslVersion);
    pSVar1 = SVar2.m_state;
  }
  else {
    SVar2 = generateRandomCoreShaderSet(this,rnd,glslVersion);
    pSVar1 = SVar2.m_state;
  }
  SVar2.m_state = pSVar1;
  SVar2.m_ptr = (Node *)this;
  return SVar2;
}

Assistant:

static ResourceDefinition::Node::SharedPtr generateRandomShaderSet (de::Random& rnd, glu::GLSLVersion glslVersion, bool onlyExtensionStages)
{
	if (!onlyExtensionStages)
		return generateRandomCoreShaderSet(rnd, glslVersion);
	else
		return generateRandomExtShaderSet(rnd, glslVersion);
}